

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  pointer *pppiVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  pointer ppiVar3;
  SBPL_Exception *this_00;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int *entry;
  EnvNAVXYTHETALATHashEntry_t *local_38;
  int *local_30;
  
  local_38 = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  local_38->X = X;
  local_38->Y = Y;
  local_38->Theta = (char)Theta;
  local_38->iteration = 0;
  __position._M_current =
       (this->StateID2CoordTable).
       super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38->stateID =
       (int)((ulong)((long)__position._M_current -
                    (long)(this->StateID2CoordTable).
                          super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (__position._M_current ==
      (this->StateID2CoordTable).
      super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>>::
    _M_realloc_insert<EnvNAVXYTHETALATHashEntry_t*const&>
              ((vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>> *)
               &this->StateID2CoordTable,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    pppEVar2 = &(this->StateID2CoordTable).
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + 1;
  }
  this->Coord2StateIDHashTable_lookup
  [(Y * (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvWidth_c + X) *
   (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.NumThetaDirs + Theta] = local_38;
  local_30 = (int *)operator_new__(8);
  __position_00._M_current =
       (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
       StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.StateID2IndexMapping
      .super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
              ((vector<int*,std::allocator<int*>> *)
               &(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                StateID2IndexMapping,__position_00,&local_30);
  }
  else {
    *__position_00._M_current = local_30;
    pppiVar1 = &(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppiVar1 = *pppiVar1 + 1;
  }
  ppiVar3 = (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  *ppiVar3[local_38->stateID] = -1;
  ppiVar3[local_38->stateID][1] = -1;
  if (local_38->stateID ==
      (int)((ulong)((long)(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                          StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppiVar3) >> 3) + -1) {
    return local_38;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR in Env... function: last state has incorrect stateID");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    int index = XYTHETA2INDEX(X,Y,Theta);

#if DEBUG
    if (Coord2StateIDHashTable_lookup[index] != NULL) {
        throw SBPL_Exception("ERROR: creating hash entry for non-NULL hashentry");
    }
#endif

    Coord2StateIDHashTable_lookup[index] = HashEntry;

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock()-currenttime;
#endif

    return HashEntry;
}